

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_BoundingBox::IsVisible(ON_BoundingBox *this,ON_Xform *bbox2c)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double *p;
  double w;
  double x;
  double bz;
  double by;
  double bx;
  uint local_38;
  uint out;
  uint some_out;
  uint all_out;
  int n;
  int k;
  int j;
  int i;
  ON_Xform *bbox2c_local;
  ON_BoundingBox *this_local;
  
  bVar1 = ON_IsValid((this->m_min).x);
  if (((!bVar1) || (bVar1 = ON_IsValid((this->m_max).x), !bVar1)) ||
     (dVar2 = (this->m_min).x, (this->m_max).x <= dVar2 && dVar2 != (this->m_max).x)) {
    this_local._4_4_ = 0;
  }
  else {
    local_38 = 0;
    out = 0xffffffff;
    k = 2;
    by = (this->m_min).x;
    while (k != 0) {
      n = 2;
      bz = (this->m_min).y;
      while (n != 0) {
        all_out = 2;
        x = (this->m_min).z;
        while (all_out != 0) {
          dVar2 = x * bbox2c->m_xform[3][2] +
                  by * bbox2c->m_xform[3][0] + bz * bbox2c->m_xform[3][1] + bbox2c->m_xform[3][3];
          dVar3 = x * bbox2c->m_xform[0][2] +
                  by * bbox2c->m_xform[0][0] + bz * bbox2c->m_xform[0][1] + bbox2c->m_xform[0][3];
          if (-dVar2 <= dVar3) {
            if (dVar3 <= dVar2) {
              bx._4_4_ = 0;
            }
            else {
              bx._4_4_ = 2;
            }
          }
          else {
            bx._4_4_ = 1;
          }
          dVar3 = x * bbox2c->m_xform[1][2] +
                  by * bbox2c->m_xform[1][0] + bz * bbox2c->m_xform[1][1] + bbox2c->m_xform[1][3];
          if (-dVar2 <= dVar3) {
            if (dVar2 < dVar3) {
              bx._4_4_ = bx._4_4_ | 8;
            }
          }
          else {
            bx._4_4_ = bx._4_4_ | 4;
          }
          dVar3 = x * bbox2c->m_xform[2][2] +
                  by * bbox2c->m_xform[2][0] + bz * bbox2c->m_xform[2][1] + bbox2c->m_xform[2][3];
          if (-dVar2 <= dVar3) {
            if (dVar2 < dVar3) {
              bx._4_4_ = bx._4_4_ | 0x20;
            }
          }
          else {
            bx._4_4_ = bx._4_4_ | 0x10;
          }
          local_38 = bx._4_4_ | local_38;
          out = bx._4_4_ & out;
          if ((local_38 != 0) && (out == 0)) {
            return 1;
          }
          x = (this->m_max).z;
          all_out = all_out - 1;
        }
        bz = (this->m_max).y;
        n = n + -1;
      }
      by = (this->m_max).x;
      k = k + -1;
    }
    this_local._4_4_ = 2;
    if (out != 0) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_BoundingBox::IsVisible( 
const ON_Xform& bbox2c
) const
{
int i,j,k,n;
unsigned int all_out, some_out, out;
double bx,by,bz,x,w;
const double* p;

  if ( !ON_IsValid(m_min.x) || !ON_IsValid(m_max.x) || m_min.x > m_max.x)
    return 0;

  some_out = 0;    // will be != 0 if some portion of box is outside visible region
  all_out  = 0xFFFFFFFF; // will be == 0 if some portion of box is inside visible region
  p = &bbox2c.m_xform[0][0];
  n = 0; 
  i = 2; bx = m_min.x;
  while(i--)
  {
    j = 2; by = m_min.y;
    while(j--)
    {
      k = 2; bz = m_min.z;
      while(k--)
      {
        w = bx*p[12] + by*p[13] + bz*p[14] + p[15];
        x = bx*p[ 0] + by*p[ 1] + bz*p[ 2] + p[ 3];
        if ( x < -w) out  = 0x01; else if (x > w) out  = 0x02; else out = 0;
        x = bx*p[ 4] + by*p[ 5] + bz*p[ 6] + p[ 7];
        if ( x < -w) out |= 0x04; else if (x > w) out |= 0x08;
        x = bx*p[ 8] + by*p[ 9] + bz*p[10] + p[11];
        if ( x < -w) out |= 0x10; else if (x > w) out |= 0x20;
        some_out |= out;
        all_out  &= out;
        if ( some_out && !all_out )
        {
          // box intersects visible region but is not completely inside it.
          return  1;
        }
        bz = m_max.z;
      }
      by = m_max.y;
    }
    bx = m_max.x;
  }

  return ( all_out ? 0 : 2 );
}